

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::PythonParameter::MergePartialFromCodedStream(PythonParameter *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  unsigned_long uVar7;
  UnknownFieldSet *unknown_fields;
  string *psVar8;
  char cVar9;
  uint tag;
  ulong uVar10;
  pair<unsigned_long,_bool> pVar11;
  
  this_00 = &this->param_str_;
  this_01 = &this->layer_;
  this_02 = &this->module_;
LAB_003b0b77:
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b0b9b;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b0b9b:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar10 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar6 | uVar10;
    }
    tag = (uint)uVar10;
    if ((uVar10 & 0x100000000) != 0) {
      cVar9 = (char)uVar10;
      switch((uint)(uVar10 >> 3) & 0x1fffffff) {
      case 1:
        if (cVar9 == '\n') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          psVar8 = (this->module_).ptr_;
          if (psVar8 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
             ) {
            google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                      (this_02,(string *)
                               &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
            psVar8 = this_02->ptr_;
          }
          bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar8);
          if (!bVar5) {
            return false;
          }
          google::protobuf::internal::WireFormatLite::VerifyUtf8String
                    ((this_02->ptr_->_M_dataplus)._M_p,(int)this_02->ptr_->_M_string_length,PARSE,
                     "caffe.PythonParameter.module");
          goto LAB_003b0b77;
        }
        break;
      case 2:
        if (cVar9 == '\x12') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          psVar8 = (this->layer_).ptr_;
          if (psVar8 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
             ) {
            google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                      (this_01,(string *)
                               &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
            psVar8 = this_01->ptr_;
          }
          bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar8);
          if (!bVar5) {
            return false;
          }
          google::protobuf::internal::WireFormatLite::VerifyUtf8String
                    ((this_01->ptr_->_M_dataplus)._M_p,(int)this_01->ptr_->_M_string_length,PARSE,
                     "caffe.PythonParameter.layer");
          goto LAB_003b0b77;
        }
        break;
      case 3:
        if (cVar9 == '\x1a') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          psVar8 = (this->param_str_).ptr_;
          if (psVar8 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
             ) {
            google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                      (this_00,(string *)
                               &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
            psVar8 = this_00->ptr_;
          }
          bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar8);
          if (!bVar5) {
            return false;
          }
          google::protobuf::internal::WireFormatLite::VerifyUtf8String
                    ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,PARSE,
                     "caffe.PythonParameter.param_str");
          goto LAB_003b0b77;
        }
        break;
      case 4:
        if (cVar9 == ' ') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) &&
             (uVar7 = (unsigned_long)(char)*puVar4, -1 < (long)uVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            uVar7 = pVar11.first;
            if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              return false;
            }
          }
          this->share_in_parallel_ = uVar7 != 0;
          goto LAB_003b0b77;
        }
      }
    }
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    pvVar3 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      unknown_fields =
           google::protobuf::internal::
           InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ::mutable_unknown_fields_slow
                     (&(this->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     );
    }
    else {
      unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
    }
    bVar5 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
    if (!bVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool PythonParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.PythonParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string module = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_module()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->module().data(), this->module().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.PythonParameter.module");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string layer = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_layer()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->layer().data(), this->layer().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.PythonParameter.layer");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string param_str = 3 [default = ""];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_param_str()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->param_str().data(), this->param_str().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.PythonParameter.param_str");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool share_in_parallel = 4 [default = false];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_share_in_parallel();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &share_in_parallel_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.PythonParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.PythonParameter)
  return false;
#undef DO_
}